

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O0

void ScaleUVRowDownEven_C
               (uint8_t *src_uv,ptrdiff_t src_stride,int src_stepx,uint8_t *dst_uv,int dst_width)

{
  int x;
  uint16_t *dst;
  uint16_t *src;
  int dst_width_local;
  uint8_t *dst_uv_local;
  int src_stepx_local;
  ptrdiff_t src_stride_local;
  uint8_t *src_uv_local;
  
  dst = (uint16_t *)dst_uv;
  src = (uint16_t *)src_uv;
  for (x = 0; x < dst_width + -1; x = x + 2) {
    *dst = *src;
    dst[1] = src[src_stepx];
    src = src + (src_stepx << 1);
    dst = dst + 2;
  }
  if ((dst_width & 1U) != 0) {
    *dst = *src;
  }
  return;
}

Assistant:

void ScaleUVRowDownEven_C(const uint8_t* src_uv,
                          ptrdiff_t src_stride,
                          int src_stepx,
                          uint8_t* dst_uv,
                          int dst_width) {
  const uint16_t* src = (const uint16_t*)(src_uv);
  uint16_t* dst = (uint16_t*)(dst_uv);
  (void)src_stride;
  int x;
  for (x = 0; x < dst_width - 1; x += 2) {
    dst[0] = src[0];
    dst[1] = src[src_stepx];
    src += src_stepx * 2;
    dst += 2;
  }
  if (dst_width & 1) {
    dst[0] = src[0];
  }
}